

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_charm_person(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  CHAR_DATA *in_RCX;
  CHAR_DATA *in_RDX;
  int in_ESI;
  __type_conflict2 _Var2;
  int count;
  CHAR_DATA *check;
  AFFECT_DATA af;
  CHAR_DATA *victim;
  CHAR_DATA *in_stack_ffffffffffffff48;
  CHAR_DATA *in_stack_ffffffffffffff50;
  CHAR_DATA *in_stack_ffffffffffffff58;
  CHAR_DATA *ch_00;
  undefined4 in_stack_ffffffffffffff60;
  int iVar3;
  CHAR_DATA *local_98;
  int in_stack_ffffffffffffff84;
  undefined2 in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff8a;
  undefined2 in_stack_ffffffffffffff8c;
  undefined2 in_stack_ffffffffffffff8e;
  int in_stack_ffffffffffffff90;
  CHAR_DATA *in_stack_ffffffffffffffc8;
  CHAR_DATA *in_stack_ffffffffffffffd0;
  
  iVar3 = 0;
  bVar1 = is_safe(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  if (!bVar1) {
    if (in_RCX == in_RDX) {
      send_to_char((char *)CONCAT44(iVar3,in_stack_ffffffffffffff60),in_stack_ffffffffffffff58);
    }
    else {
      bVar1 = is_affected_by(in_stack_ffffffffffffff58,
                             (int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
      if (((!bVar1) &&
          (bVar1 = is_affected_by(in_stack_ffffffffffffff58,
                                  (int)((ulong)in_stack_ffffffffffffff50 >> 0x20)), !bVar1)) &&
         (in_RCX->level <= in_ESI)) {
        ch_00 = (CHAR_DATA *)in_RCX->imm_flags[0];
        _Var2 = std::pow<int,int>(0,0x6132e5);
        if (((ulong)ch_00 & (long)_Var2) == 0) {
          bVar1 = is_npc(in_stack_ffffffffffffff48);
          if (bVar1) {
            in_stack_ffffffffffffff50 = (CHAR_DATA *)in_RCX->act[0];
            _Var2 = std::pow<int,int>(0,0x61332e);
            if (((ulong)in_stack_ffffffffffffff50 & (long)_Var2) != 0) {
              return;
            }
          }
          bVar1 = saves_spell(in_stack_ffffffffffffff90,
                              (CHAR_DATA *)
                              CONCAT26(in_stack_ffffffffffffff8e,
                                       CONCAT24(in_stack_ffffffffffffff8c,
                                                CONCAT22(in_stack_ffffffffffffff8a,
                                                         in_stack_ffffffffffffff88))),
                              in_stack_ffffffffffffff84);
          if (!bVar1) {
            for (local_98 = char_list; local_98 != (CHAR_DATA *)0x0; local_98 = local_98->next) {
              if ((local_98->leader == in_RDX) &&
                 (bVar1 = is_affected_by(ch_00,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20)),
                 bVar1)) {
                iVar3 = iVar3 + 1;
              }
            }
            if ((((in_RDX->level < 0x28) && (0 < iVar3)) || ((in_RDX->level < 0x34 && (1 < iVar3))))
               || (2 < iVar3)) {
              send_to_char((char *)CONCAT44(iVar3,in_stack_ffffffffffffff60),ch_00);
            }
            else {
              if (in_RCX->master != (CHAR_DATA *)0x0) {
                stop_follower(in_stack_ffffffffffffff50);
              }
              add_follower(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
              in_RCX->leader = in_RDX;
              init_affect((AFFECT_DATA *)0x613468);
              number_fuzzy((int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
              std::pow<int,int>(0,0x6134ce);
              affect_to_char(in_stack_ffffffffffffff50,(AFFECT_DATA *)in_stack_ffffffffffffff48);
              act((char *)CONCAT44(iVar3,in_stack_ffffffffffffff60),ch_00,in_stack_ffffffffffffff50,
                  in_stack_ffffffffffffff48,0);
              if (in_RDX != in_RCX) {
                act((char *)CONCAT44(iVar3,in_stack_ffffffffffffff60),ch_00,
                    in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,0);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void spell_charm_person(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;
	CHAR_DATA *check;
	int count;

	count = 0;

	if (is_safe(ch, victim))
		return;

	if (victim == ch)
	{
		send_to_char("You like yourself even better!\n\r", ch);
		return;
	}

	if (is_affected_by(victim, AFF_CHARM)
		|| is_affected_by(ch, AFF_CHARM)
		|| level < victim->level
		|| IS_SET(victim->imm_flags, IMM_CHARM)
		|| (is_npc(victim) && IS_SET(victim->act, ACT_AGGRESSIVE))
		|| saves_spell(level - 3, victim, DAM_CHARM))
	{
		return;
	}

	for (check = char_list; check != nullptr; check = check->next)
	{
		if (check->leader == ch && is_affected_by(check, AFF_CHARM))
			count++;
	}

	if ((ch->level < 40 && count > 0) || (ch->level < 52 && count > 1) || count > 2)
	{
		send_to_char("You already control as many charmies as you can.\n\r", ch);
		return;
	}

	if (victim->master)
		stop_follower(victim);

	add_follower(victim, ch);

	victim->leader = ch;

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = sn;
	af.level = level;
	af.duration = number_fuzzy(level / 4);
	af.location = 0;
	af.modifier = 0;
	af.mod_name = MOD_CONC;

	SET_BIT(af.bitvector, AFF_CHARM);

	affect_to_char(victim, &af);

	act("Isn't $n just so nice?", ch, nullptr, victim, TO_VICT);

	if (ch != victim)
		act("$N looks at you with adoring eyes.", ch, nullptr, victim, TO_CHAR);
}